

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::AddGlobalTarget_PackageSource
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  pointer puVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  string *psVar4;
  long lVar5;
  allocator<char> local_159;
  cmCustomCommandLine singleLine;
  cmAlphaNum local_120;
  string configFile;
  GlobalTargetInfo gti;
  
  iVar3 = (*this->_vptr_cmGlobalGenerator[0x20])();
  if (CONCAT44(extraout_var,iVar3) != 0) {
    puVar1 = (this->Makefiles).
             super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                       ((cmMakefile *)
                        (puVar1->_M_t).
                        super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t);
    gti.Name._M_string_length = (size_type)(psVar4->_M_dataplus)._M_p;
    gti.Name._M_dataplus._M_p = (pointer)psVar4->_M_string_length;
    local_120.View_._M_len = (size_t)&DAT_00000018;
    local_120.View_._M_str = "/CPackSourceConfig.cmake";
    cmStrCat<>(&configFile,(cmAlphaNum *)&gti,&local_120);
    bVar2 = cmsys::SystemTools::FileExists(&configFile);
    if (bVar2) {
      lVar5 = 0x10;
      do {
        lVar5 = lVar5 + -8;
        if (lVar5 == 0) {
          gti.Name._M_dataplus._M_p = (pointer)&gti.Name.field_2;
          gti.Name._M_string_length = 0;
          gti.Name.field_2._M_local_buf[0] = '\0';
          gti.Message._M_dataplus._M_p = (pointer)&gti.Message.field_2;
          gti.Message._M_string_length = 0;
          gti.Message.field_2._M_local_buf[0] = '\0';
          gti.WorkingDir._M_dataplus._M_p = (pointer)&gti.WorkingDir.field_2;
          gti.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          gti.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          gti.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          gti.Depends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          gti.Depends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          gti.Depends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          gti.WorkingDir._M_string_length = 0;
          gti.WorkingDir.field_2._M_local_buf[0] = '\0';
          gti.UsesTerminal = false;
          gti.PerConfig = Yes;
          gti.StdPipesUTF8 = false;
          std::__cxx11::string::assign((char *)&gti);
          std::__cxx11::string::assign((char *)&gti.Message);
          cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                    ((cmMakefile *)
                     (puVar1->_M_t).
                     super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t);
          std::__cxx11::string::_M_assign((string *)&gti.WorkingDir);
          gti.UsesTerminal = true;
          singleLine.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          singleLine.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          singleLine.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          psVar4 = cmSystemTools::GetCPackCommand_abi_cxx11_();
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&singleLine.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ,psVar4);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_120,"--config",&local_159);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &singleLine,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120
                    );
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_120,"./CPackSourceConfig.cmake",&local_159);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &singleLine,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120
                    );
          std::__cxx11::string::~string((string *)&local_120);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &singleLine,&configFile);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
          emplace_back<cmCustomCommandLine>
                    (&gti.CommandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                     &singleLine);
          std::
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          ::emplace_back<cmGlobalGenerator::GlobalTargetInfo>(targets,&gti);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&singleLine.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   );
          GlobalTargetInfo::~GlobalTargetInfo(&gti);
          break;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&gti,"package_source",(allocator<char> *)&singleLine);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,"when CPack source packaging is enabled",&local_159);
        bVar2 = CheckCMP0037(this,&gti.Name,(string *)&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&gti);
      } while (bVar2);
    }
    std::__cxx11::string::~string((string *)&configFile);
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_PackageSource(
  std::vector<GlobalTargetInfo>& targets)
{
  const char* packageSourceTargetName = this->GetPackageSourceTargetName();
  if (!packageSourceTargetName) {
    return;
  }

  auto& mf = this->Makefiles[0];
  std::string configFile =
    cmStrCat(mf->GetCurrentBinaryDirectory(), "/CPackSourceConfig.cmake");
  if (!cmSystemTools::FileExists(configFile)) {
    return;
  }

  static const auto reservedTargets = { "package_source" };
  for (auto const& target : reservedTargets) {
    if (!this->CheckCMP0037(target,
                            "when CPack source packaging is enabled")) {
      return;
    }
  }

  GlobalTargetInfo gti;
  gti.Name = packageSourceTargetName;
  gti.Message = "Run CPack packaging tool for source...";
  gti.WorkingDir = mf->GetCurrentBinaryDirectory();
  gti.UsesTerminal = true;
  cmCustomCommandLine singleLine;
  singleLine.push_back(cmSystemTools::GetCPackCommand());
  singleLine.push_back("--config");
  singleLine.push_back("./CPackSourceConfig.cmake");
  singleLine.push_back(std::move(configFile));
  gti.CommandLines.push_back(std::move(singleLine));
  targets.push_back(std::move(gti));
}